

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O1

void __thiscall QTableView::dropEvent(QTableView *this,QDropEvent *event)

{
  long *plVar1;
  long *plVar2;
  int *piVar3;
  long lVar4;
  char cVar5;
  DragDropMode DVar6;
  int iVar7;
  int iVar8;
  undefined4 uVar9;
  QTableView *pQVar10;
  iterator __first;
  iterator __last;
  QAbstractItemModel *pQVar11;
  long lVar12;
  QModelIndex *index;
  int *piVar13;
  long lVar14;
  long lVar15;
  QPersistentModelIndex *pQVar16;
  long in_FS_OFFSET;
  bool bVar17;
  QPersistentModelIndex firstColIndex;
  QPersistentModelIndex dropRow;
  int row;
  int col;
  QPersistentModelIndex local_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  QPersistentModelIndex local_c0;
  QModelIndex local_b8;
  QArrayDataPointer<QPersistentModelIndex> local_98;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined1 *local_68;
  int local_60;
  int local_5c;
  long local_58 [4];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  plVar1 = *(long **)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                      super_QWidget.field_0x8;
  pQVar10 = (QTableView *)QDropEvent::source();
  if ((pQVar10 != this) ||
     ((*(int *)(event + 0x2c) != 2 &&
      (DVar6 = QAbstractItemView::dragDropMode((QAbstractItemView *)this), DVar6 != InternalMove))))
  goto LAB_005974cb;
  local_58[0] = -1;
  local_58[1] = 0;
  local_58[2] = 0;
  local_5c = -1;
  local_60 = -1;
  if ((event[0xc] != (QDropEvent)0x0) ||
     (cVar5 = (**(code **)(*plVar1 + 0x110))(plVar1,event,&local_60,&local_5c,local_58),
     cVar5 == '\0')) goto LAB_005974cb;
  bVar17 = false;
  if ((-1 < (int)local_58[0]) && (bVar17 = false, -1 < local_58[0])) {
    bVar17 = local_58[2] != 0;
  }
  if ((bVar17) || (local_5c == -1)) goto LAB_005974cb;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  local_78 = 0xaaaaaaaa;
  uStack_74 = 0xaaaaaaaa;
  uStack_70 = 0xaaaaaaaa;
  uStack_6c = 0xaaaaaaaa;
  (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                         super_QWidget + 0x2d8))(&local_78,this);
  local_98.d = (Data *)0x0;
  local_98.ptr = (QPersistentModelIndex *)0x0;
  local_98.size = 0;
  QList<QPersistentModelIndex>::reserve
            ((QList<QPersistentModelIndex> *)&local_98,(qsizetype)local_68);
  if (local_68 == (undefined1 *)0x0) {
LAB_0059778d:
    __first = QList<QPersistentModelIndex>::begin((QList<QPersistentModelIndex> *)&local_98);
    __last = QList<QPersistentModelIndex>::end((QList<QPersistentModelIndex> *)&local_98);
    std::sort<QList<QPersistentModelIndex>::iterator>(__first,__last);
    local_c0.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
    pQVar11 = QAbstractItemView::model((QAbstractItemView *)this);
    (**(code **)(*(long *)pQVar11 + 0x60))(&local_b8,pQVar11,local_60,local_5c,local_58);
    QPersistentModelIndex::QPersistentModelIndex(&local_c0,&local_b8);
    if (local_60 == -1) {
      pQVar11 = QAbstractItemView::model((QAbstractItemView *)this);
      local_b8.r = -1;
      local_b8.c = -1;
      local_b8.i = 0;
      local_b8.m.ptr = (QAbstractItemModel *)0x0;
      iVar8 = (**(code **)(*(long *)pQVar11 + 0x78))(pQVar11);
    }
    else {
      iVar7 = QPersistentModelIndex::row();
      iVar8 = local_60;
      if (-1 < iVar7) {
        iVar8 = QPersistentModelIndex::row();
      }
    }
    if (local_98.size != 0) {
      lVar14 = local_98.size << 3;
      bVar17 = false;
      do {
        iVar7 = QPersistentModelIndex::row();
        if ((iVar8 == iVar7) || (iVar7 = QPersistentModelIndex::row(), iVar8 == iVar7 + 1)) {
LAB_005978f7:
          bVar17 = true;
          iVar8 = QPersistentModelIndex::row();
          iVar8 = iVar8 + 1;
        }
        else {
          pQVar11 = QAbstractItemView::model((QAbstractItemView *)this);
          local_b8.r = -1;
          local_b8.c = -1;
          local_b8.i = 0;
          local_b8.m.ptr = (QAbstractItemModel *)0x0;
          uVar9 = QPersistentModelIndex::row();
          local_d8.d = (QPersistentModelIndexData *)0xffffffffffffffff;
          local_d0 = 0;
          uStack_c8 = 0;
          cVar5 = (**(code **)(*(long *)pQVar11 + 0x118))(pQVar11,&local_b8,uVar9,1,&local_d8,iVar8)
          ;
          if (cVar5 != '\0') goto LAB_005978f7;
        }
        lVar14 = lVar14 + -8;
      } while (lVar14 != 0);
      if (bVar17) {
        *(undefined1 *)((long)plVar1 + 0x3e5) = 1;
        event[0xc] = (QDropEvent)0x1;
      }
    }
    QPersistentModelIndex::~QPersistentModelIndex(&local_c0);
  }
  else {
    piVar13 = (int *)CONCAT44(uStack_6c,uStack_70);
    piVar3 = piVar13 + (long)local_68 * 6;
    bVar17 = false;
    do {
      local_d8.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
      plVar2 = *(long **)(piVar13 + 4);
      if (plVar2 == (long *)0x0) {
        local_b8.r = -1;
        local_b8.c = -1;
        local_b8.i = 0;
        local_b8.m.ptr = (QAbstractItemModel *)0x0;
      }
      else if (piVar13[1] == 0) {
        local_b8.m.ptr = *(QAbstractItemModel **)(piVar13 + 4);
        local_b8.r = piVar13[0];
        local_b8.c = piVar13[1];
        local_b8.i = *(quintptr *)(piVar13 + 2);
      }
      else {
        (**(code **)(*plVar2 + 0x70))(&local_b8,plVar2,*piVar13,0,piVar13);
      }
      QPersistentModelIndex::QPersistentModelIndex(&local_d8,&local_b8);
      if (local_98.size == 0) {
LAB_0059771c:
        lVar15 = -1;
      }
      else {
        lVar14 = local_98.size << 3;
        lVar4 = 8 - (long)local_98.ptr;
        pQVar16 = local_98.ptr;
        do {
          lVar15 = lVar4;
          lVar12 = lVar14;
          if (lVar12 == 0) goto LAB_00597712;
          cVar5 = comparesEqual(pQVar16,&local_d8);
          pQVar16 = pQVar16 + 1;
          lVar14 = lVar12 + -8;
          lVar4 = lVar15 + -8;
        } while (cVar5 == '\0');
        lVar15 = -((long)&local_98.ptr[-1].d + lVar15) >> 3;
LAB_00597712:
        if (lVar12 == 0) goto LAB_0059771c;
      }
      if (lVar15 == -1) {
        QtPrivate::QMovableArrayOps<QPersistentModelIndex>::emplace<QPersistentModelIndex_const&>
                  ((QMovableArrayOps<QPersistentModelIndex> *)&local_98,local_98.size,&local_d8);
        QList<QPersistentModelIndex>::end((QList<QPersistentModelIndex> *)&local_98);
      }
      iVar8 = *piVar13;
      iVar7 = (int)local_58[0];
      QPersistentModelIndex::~QPersistentModelIndex(&local_d8);
      if (iVar8 == iVar7) {
        bVar17 = true;
        break;
      }
      piVar13 = piVar13 + 6;
    } while (piVar13 != piVar3);
    if (!bVar17) goto LAB_0059778d;
  }
  QArrayDataPointer<QPersistentModelIndex>::~QArrayDataPointer(&local_98);
  piVar3 = (int *)CONCAT44(uStack_74,local_78);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(uStack_74,local_78),0x18,0x10);
    }
  }
LAB_005974cb:
  if (event[0xc] == (QDropEvent)0x0) {
    QAbstractItemView::dropEvent((QAbstractItemView *)this,event);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTableView::dropEvent(QDropEvent *event)
{
    Q_D(QTableView);
    if (event->source() == this && (event->dropAction() == Qt::MoveAction ||
                                    dragDropMode() == QAbstractItemView::InternalMove)) {
        QModelIndex topIndex;
        int col = -1;
        int row = -1;
        // check whether a subclass has already accepted the event, ie. moved the data
        if (!event->isAccepted() && d->dropOn(event, &row, &col, &topIndex) && !topIndex.isValid() && col != -1) {
            // Drop between items (reordering) - can only happen with setDragDropOverwriteMode(false)
            const QModelIndexList indexes = selectedIndexes();
            QList<QPersistentModelIndex> persIndexes;
            persIndexes.reserve(indexes.size());

            bool topIndexDropped = false;
            for (const auto &index : indexes) {
                // Reorder entire rows
                QPersistentModelIndex firstColIndex = index.siblingAtColumn(0);
                if (!persIndexes.contains(firstColIndex))
                    persIndexes.append(firstColIndex);
                if (index.row() == topIndex.row()) {
                    topIndexDropped = true;
                    break;
                }
            }
            if (!topIndexDropped) {
                std::sort(persIndexes.begin(), persIndexes.end()); // The dropped items will remain in the same visual order.

                QPersistentModelIndex dropRow = model()->index(row, col, topIndex);

                int r = row == -1 ? model()->rowCount() : (dropRow.row() >= 0 ? dropRow.row() : row);
                bool dataMoved = false;
                for (const QPersistentModelIndex &pIndex : std::as_const(persIndexes)) {
                    // only generate a move when not same row or behind itself
                    if (r != pIndex.row() && r != pIndex.row() + 1) {
                        // try to move (preserves selection)
                        const bool moved = model()->moveRow(QModelIndex(), pIndex.row(), QModelIndex(), r);
                        if (!moved)
                            continue; // maybe it'll work for other rows
                        dataMoved = true; // success
                    } else {
                        // move onto itself is blocked, don't delete anything
                        dataMoved = true;
                    }
                    r = pIndex.row() + 1;   // Dropped items are inserted contiguously and in the right order.
                }
                if (dataMoved) {
                    d->dropEventMoved = true;
                    event->accept();
                }
            }
        }
    }

    if (!event->isAccepted()) {
        // moveRows not implemented, fall back to default
        QAbstractItemView::dropEvent(event);
    }
}